

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLin>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  ImU32 IVar2;
  uint uVar3;
  GetterXsYs<double> *pGVar4;
  ImDrawVert *pIVar5;
  ImDrawIdx *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  int iVar9;
  long lVar10;
  ImDrawIdx IVar11;
  ImVec2 IVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pGVar4 = this->Getter;
  iVar9 = pGVar4->Count;
  lVar10 = (long)(((pGVar4->Offset + prim + 1) % iVar9 + iVar9) % iVar9) * (long)pGVar4->Stride;
  iVar9 = this->Transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar9].Min;
  IVar12.x = (float)(GImPlot->Mx *
                     (*(double *)((long)pGVar4->Xs + lVar10) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
  IVar12.y = (float)(GImPlot->My[iVar9] *
                     (*(double *)((long)pGVar4->Ys + lVar10) -
                     GImPlot->CurrentPlot->YAxis[iVar9].Range.Min) + (double)IVar1.y);
  fVar13 = (this->P1).x;
  fVar14 = (this->P1).y;
  auVar16._0_4_ = ~-(uint)(IVar12.x <= fVar13) & (uint)IVar12.x;
  auVar16._4_4_ = ~-(uint)(IVar12.y <= fVar14) & (uint)IVar12.y;
  auVar16._8_4_ = ~-(uint)(fVar13 < IVar12.x) & (uint)IVar12.x;
  auVar16._12_4_ = ~-(uint)(fVar14 < IVar12.y) & (uint)IVar12.y;
  auVar7._4_4_ = (uint)fVar14 & -(uint)(IVar12.y <= fVar14);
  auVar7._0_4_ = (uint)fVar13 & -(uint)(IVar12.x <= fVar13);
  auVar7._8_4_ = (uint)fVar13 & -(uint)(fVar13 < IVar12.x);
  auVar7._12_4_ = (uint)fVar14 & -(uint)(fVar14 < IVar12.y);
  auVar16 = auVar16 | auVar7;
  fVar15 = (cull_rect->Min).y;
  auVar8._4_8_ = auVar16._8_8_;
  auVar8._0_4_ = -(uint)(auVar16._4_4_ < fVar15);
  auVar17._0_8_ = auVar8._0_8_ << 0x20;
  auVar17._8_4_ = -(uint)(auVar16._8_4_ < (cull_rect->Max).x);
  auVar17._12_4_ = -(uint)(auVar16._12_4_ < (cull_rect->Max).y);
  auVar18._4_4_ = -(uint)(fVar15 < auVar16._4_4_);
  auVar18._0_4_ = -(uint)((cull_rect->Min).x < auVar16._0_4_);
  auVar18._8_8_ = auVar17._8_8_;
  iVar9 = movmskps((int)lVar10,auVar18);
  if (iVar9 == 0xf) {
    fVar15 = fVar14 + this->HalfWeight;
    fVar14 = fVar14 - this->HalfWeight;
    IVar2 = this->Col;
    IVar1 = *uv;
    pIVar5 = DrawList->_VtxWritePtr;
    (pIVar5->pos).x = fVar13;
    (pIVar5->pos).y = fVar15;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5->col = IVar2;
    pIVar5[1].pos.x = IVar12.x;
    pIVar5[1].pos.y = fVar14;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[1].col = IVar2;
    pIVar5[2].pos.x = fVar13;
    pIVar5[2].pos.y = fVar14;
    pIVar5[2].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[2].col = IVar2;
    pIVar5[3].pos.x = IVar12.x;
    pIVar5[3].pos.y = fVar15;
    pIVar5[3].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[3].col = IVar2;
    DrawList->_VtxWritePtr = pIVar5 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    pIVar6 = DrawList->_IdxWritePtr;
    IVar11 = (ImDrawIdx)uVar3;
    *pIVar6 = IVar11;
    pIVar6[1] = IVar11 + 1;
    pIVar6[2] = IVar11 + 2;
    pIVar6[3] = IVar11;
    pIVar6[4] = IVar11 + 1;
    pIVar6[5] = IVar11 + 3;
    DrawList->_IdxWritePtr = pIVar6 + 6;
    DrawList->_VtxCurrentIdx = uVar3 + 4;
    fVar14 = IVar12.x - this->HalfWeight;
    fVar13 = this->HalfWeight + IVar12.x;
    fVar15 = (this->P1).y;
    IVar2 = this->Col;
    IVar1 = *uv;
    pIVar5[4].pos.x = fVar14;
    pIVar5[4].pos.y = IVar12.y;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5->col = IVar2;
    pIVar5[1].pos.x = fVar13;
    pIVar5[1].pos.y = fVar15;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[1].col = IVar2;
    pIVar5[2].pos.x = fVar14;
    pIVar5[2].pos.y = fVar15;
    pIVar5[2].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[2].col = IVar2;
    pIVar5[3].pos.x = fVar13;
    pIVar5[3].pos.y = IVar12.y;
    pIVar5[3].uv = IVar1;
    pIVar5 = DrawList->_VtxWritePtr;
    pIVar5[3].col = IVar2;
    DrawList->_VtxWritePtr = pIVar5 + 4;
    uVar3 = DrawList->_VtxCurrentIdx;
    pIVar6 = DrawList->_IdxWritePtr;
    IVar11 = (ImDrawIdx)uVar3;
    *pIVar6 = IVar11;
    pIVar6[1] = IVar11 + 1;
    pIVar6[2] = IVar11 + 2;
    pIVar6[3] = IVar11;
    pIVar6[4] = IVar11 + 1;
    pIVar6[5] = IVar11 + 3;
    DrawList->_IdxWritePtr = pIVar6 + 6;
    DrawList->_VtxCurrentIdx = uVar3 + 4;
  }
  this->P1 = IVar12;
  return (char)iVar9 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }